

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QTextObjectHandler>_>::findOrInsert<int>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::Node<int,_QTextObjectHandler>_> *this,int *key)

{
  Span *pSVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  Bucket BVar5;
  size_t *local_38;
  
  uVar3 = (long)*key ^ this->seed;
  uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
  uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
  uVar3 = uVar3 >> 0x20 ^ uVar3;
  if (this->numBuckets == 0) {
    uVar4 = this->size;
LAB_004752fa:
    rehash(this,uVar4 + 1);
    BVar5 = findBucketWithHash<int>(this,key,uVar3);
  }
  else {
    BVar5 = findBucketWithHash<int>(this,key,uVar3);
    bVar2 = true;
    if ((BVar5.span)->offsets[BVar5.index] != 0xff) goto LAB_0047532d;
    uVar4 = this->size;
    if (this->numBuckets >> 1 <= uVar4) goto LAB_004752fa;
  }
  local_38 = &this->size;
  Span<QHashPrivate::Node<int,_QTextObjectHandler>_>::insert(BVar5.span,BVar5.index);
  *local_38 = *local_38 + 1;
  bVar2 = false;
LAB_0047532d:
  pSVar1 = this->spans;
  (__return_storage_ptr__->it).d = this;
  (__return_storage_ptr__->it).bucket =
       ((ulong)((long)BVar5.span - (long)pSVar1) >> 4) * 0x1c71c71c71c71c80 | BVar5.index;
  __return_storage_ptr__->initialized = bVar2;
  return __return_storage_ptr__;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }